

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void benchmark_rmu_uncontended(testing t)

{
  undefined1 local_28 [8];
  nsync_mu mu;
  int n;
  int i;
  testing t_local;
  
  mu.waiters._0_4_ = testing_n(t);
  nsync::nsync_mu_init((nsync_mu *)local_28);
  for (mu.waiters._4_4_ = 0; mu.waiters._4_4_ != (int)mu.waiters;
      mu.waiters._4_4_ = mu.waiters._4_4_ + 1) {
    nsync::nsync_mu_rlock((nsync_mu *)local_28);
    nsync::nsync_mu_runlock((nsync_mu *)local_28);
  }
  return;
}

Assistant:

static void benchmark_rmu_uncontended (testing t) {
	int i;
	int n = testing_n (t);
	nsync_mu mu;
	nsync_mu_init (&mu);
	for (i = 0; i != n; i++) {
		nsync_mu_rlock (&mu);
		nsync_mu_runlock (&mu);
	}
}